

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O3

void destroyQueue(queue *q)

{
  size_t sVar1;
  long lVar2;
  
  if (q == (queue *)0x0) {
    return;
  }
  if (q->size != 0) {
    do {
      destroyChunk(q->elements[q->head]);
      sVar1 = q->size;
      if (sVar1 == 0) break;
      q->size = sVar1 - 1;
      lVar2 = q->head;
      q->elements[lVar2] = (chunk *)0x0;
      q->head = (lVar2 + 1U) % q->capacity;
    } while (sVar1 != 1);
  }
  free(q->elements);
  free(q);
  return;
}

Assistant:

inline void destroyQueue(queue* q)
{
   if (q != NULL)
   {
       while (q->size > 0) //pop any chunks in the queue and free them
       {
           destroyChunk(front(q));
           deque(q);
       }

       free(q->elements); //free the elements chunk*[]
       free(q); //free the q
   }
}